

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O0

bool __thiscall Js::DynamicObject::GetHasNoEnumerableProperties(DynamicObject *this)

{
  bool bVar1;
  uint uVar2;
  uint32 uVar3;
  DynamicTypeHandler *pDVar4;
  DynamicType *this_00;
  JavascriptArray *this_01;
  DynamicObject *this_local;
  
  pDVar4 = GetTypeHandler(this);
  uVar2 = (*pDVar4->_vptr_DynamicTypeHandler[0x10])(pDVar4,this);
  if ((uVar2 & 1) == 0) {
    return false;
  }
  this_00 = GetDynamicType(this);
  bVar1 = DynamicType::GetHasNoEnumerableProperties(this_00);
  if (!bVar1) {
    return false;
  }
  bVar1 = HasObjectArray(this);
  if (bVar1) {
LAB_01405a00:
    this_local._7_1_ = false;
  }
  else {
    bVar1 = Js::JavascriptArray::IsNonES5Array(this);
    if (bVar1) {
      this_01 = VarTo<Js::JavascriptArray,Js::DynamicObject>(this);
      uVar3 = ArrayObject::GetLength(&this_01->super_ArrayObject);
      if (uVar3 != 0) goto LAB_01405a00;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
    DynamicObject::GetHasNoEnumerableProperties()
    {
        if (!this->GetTypeHandler()->EnsureObjectReady(this))
        {
            return false;
        }

        if (!this->GetDynamicType()->GetHasNoEnumerableProperties())
        {
            return false;
        }
        if (HasObjectArray() || (JavascriptArray::IsNonES5Array(this) && VarTo<JavascriptArray>(this)->GetLength() != 0))
        {
            return false;
        }
        return true;
    }